

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

llb_build_key_t * llb_build_key_make(llb_data_t *data)

{
  CAPIBuildKey *this;
  KeyType local_50;
  BuildKey local_30;
  llb_data_t *local_10;
  llb_data_t *data_local;
  
  local_10 = data;
  this = (CAPIBuildKey *)operator_new(0x38);
  llbuild::core::KeyType::KeyType(&local_50,(char *)local_10->data,local_10->length);
  llbuild::buildsystem::BuildKey::fromData(&local_30,&local_50);
  anon_unknown.dwarf_1e10c2::CAPIBuildKey::CAPIBuildKey(this,&local_30);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_30);
  llbuild::core::KeyType::~KeyType(&local_50);
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make(const llb_data_t *data) {
  return (llb_build_key_t *)new CAPIBuildKey(
    BuildKey::fromData(core::KeyType(
      reinterpret_cast<const char*>(data->data), static_cast<size_t>(data->length)
    ))
  );
}